

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkreplyfileimpl.cpp
# Opt level: O1

void __thiscall QNetworkReplyFileImpl::~QNetworkReplyFileImpl(QNetworkReplyFileImpl *this)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  QObject *pQVar5;
  long *plVar6;
  long in_FS_OFFSET;
  void *local_38;
  char *pcStack_30;
  QMetaTypeInterface *local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined ***)this = &PTR_metaObject_002d0890;
  lVar1 = *(long *)(this + 8);
  if (((*(long *)(lVar1 + 0x238) != 0) && (*(int *)(*(long *)(lVar1 + 0x238) + 4) != 0)) &&
     (*(long *)(lVar1 + 0x240) != 0)) {
    lVar3 = QObject::thread();
    lVar4 = QThread::currentThread();
    lVar2 = *(long *)(lVar1 + 0x238);
    if (lVar3 == lVar4) {
      if ((lVar2 == 0) || (*(int *)(lVar2 + 4) == 0)) {
        plVar6 = (long *)0x0;
      }
      else {
        plVar6 = *(long **)(lVar1 + 0x240);
      }
      if (plVar6 != (long *)0x0) {
        (**(code **)(*plVar6 + 0x20))();
      }
    }
    else {
      if ((lVar2 == 0) || (*(int *)(lVar2 + 4) == 0)) {
        pQVar5 = (QObject *)0x0;
      }
      else {
        pQVar5 = *(QObject **)(lVar1 + 0x240);
      }
      local_38 = (void *)0x0;
      pcStack_30 = (char *)0x0;
      local_28 = (QMetaTypeInterface *)0x0;
      QMetaObject::invokeMethodImpl
                (pQVar5,"deleteLater",QueuedConnection,1,&local_38,&pcStack_30,&local_28);
    }
  }
  QNetworkReply::~QNetworkReply((QNetworkReply *)this);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QNetworkReplyFileImpl::~QNetworkReplyFileImpl()
{
    QNetworkReplyFileImplPrivate *d = (QNetworkReplyFileImplPrivate*) d_func();
    if (d->realFile) {
        if (d->realFile->thread() == QThread::currentThread())
            delete d->realFile;
        else
            QMetaObject::invokeMethod(d->realFile, "deleteLater", Qt::QueuedConnection);
    }
}